

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O1

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::genMaxSSBlocksSource
              (NegativeTestContext *ctx,GLenum glShaderType,ProgramSources *sources)

{
  int iVar1;
  ShaderType SVar2;
  GLenum in_R8D;
  string shaderSrc;
  string local_48;
  
  iVar1 = getMaxSSBlockSize(ctx,glShaderType);
  (anonymous_namespace)::genBlockSource_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(long)iVar1,
             (ulong)glShaderType,in_R8D);
  SVar2 = getGLUShaderType(glShaderType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources->sources + SVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int genMaxSSBlocksSource (NegativeTestContext& ctx, glw::GLenum glShaderType, glu::ProgramSources& sources)
{
	int		maxSSBlocks				= getMaxSSBlockSize(ctx, glShaderType);
	const	std::string shaderSrc	= genBlockSource(ctx, (maxSSBlocks), glShaderType);

	sources.sources[getGLUShaderType(glShaderType)].push_back(shaderSrc);

	return maxSSBlocks;
}